

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVIMaker.cpp
# Opt level: O0

void __thiscall AVIMaker::addFrame(AVIMaker *this,size_t stream_id,TRIPLERGB **frame)

{
  reference ppVVar1;
  VideoStream *videoStream;
  TRIPLERGB **frame_local;
  size_t stream_id_local;
  AVIMaker *this_local;
  
  videoStream = (VideoStream *)frame;
  frame_local = (TRIPLERGB **)stream_id;
  stream_id_local = (size_t)this;
  ppVVar1 = std::vector<VideoStream_*,_std::allocator<VideoStream_*>_>::operator[]
                      (&this->videoStreams,stream_id);
  std::vector<TRIPLERGB_**,_std::allocator<TRIPLERGB_**>_>::push_back
            (&(*ppVVar1)->frames,(value_type *)&videoStream);
  return;
}

Assistant:

void AVIMaker::addFrame(size_t stream_id, TRIPLERGB **frame) {
    VideoStream *videoStream = this->videoStreams[stream_id];
    videoStream->frames.push_back(frame);
}